

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

void __thiscall
wasm::WATParser::anon_unknown_11::WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx>
::~WithPosition(WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx> *this)

{
  uint in_ESI;
  
  *(ulong *)&this[1].original = (ulong)in_ESI;
  Lexer::skipSpace((Lexer *)&this->original);
  Lexer::lexToken((Lexer *)&this->original);
  return;
}

Assistant:

~WithPosition() { ctx.in.lexer.setIndex(original); }